

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O3

RealType __thiscall OpenMD::Bond::getValue(Bond *this,int snap)

{
  undefined4 *puVar1;
  double *pdVar2;
  double dVar3;
  Atom *pAVar4;
  SnapshotManager *pSVar5;
  double dVar6;
  uint i;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  undefined4 extraout_var_01;
  long lVar9;
  double tmp;
  Vector<double,_3U> result;
  undefined8 local_98;
  undefined8 uStack_90;
  double local_88;
  double local_78 [4];
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  Vector3d local_38;
  
  pAVar4 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  iVar7 = (*((pAVar4->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar9 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar8 = *(long *)(CONCAT44(extraout_var,iVar7) + (pAVar4->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar8 + lVar9 * 0x18);
  local_58._0_4_ = *puVar1;
  local_58._4_4_ = puVar1[1];
  uStack_50 = puVar1[2];
  uStack_4c = puVar1[3];
  local_48 = *(undefined8 *)(lVar8 + 0x10 + lVar9 * 0x18);
  pAVar4 = *(this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar5 = (pAVar4->super_StuntDouble).snapshotMan_;
  iVar7 = (*pSVar5->_vptr_SnapshotManager[4])(pSVar5,snap);
  lVar9 = (long)(pAVar4->super_StuntDouble).localIndex_;
  lVar8 = *(long *)(CONCAT44(extraout_var_00,iVar7) + (pAVar4->super_StuntDouble).storage_);
  pdVar2 = (double *)(lVar8 + lVar9 * 0x18);
  local_78[0] = *pdVar2;
  local_78[1] = pdVar2[1];
  local_78[2] = (double)*(undefined8 *)(lVar8 + 0x10 + lVar9 * 0x18);
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0.0;
  lVar8 = 0;
  do {
    (&local_98)[lVar8] = (double)(&local_58)[lVar8] - local_78[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_38.super_Vector<double,_3U>.data_[2] = local_88;
  local_38.super_Vector<double,_3U>.data_[0]._0_4_ = (undefined4)local_98;
  local_38.super_Vector<double,_3U>.data_[0]._4_4_ = local_98._4_4_;
  local_38.super_Vector<double,_3U>.data_[1]._0_4_ = (undefined4)uStack_90;
  local_38.super_Vector<double,_3U>.data_[1]._4_4_ = uStack_90._4_4_;
  pSVar5 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar7 = (*pSVar5->_vptr_SnapshotManager[4])(pSVar5,snap);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_01,iVar7),&local_38);
  dVar6 = 0.0;
  lVar8 = 0;
  do {
    dVar3 = local_38.super_Vector<double,_3U>.data_[lVar8];
    dVar6 = dVar6 + dVar3 * dVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar6;
}

Assistant:

RealType getValue(int snap) {
      Vector3d r12 = atoms_[1]->getPos(snap) - atoms_[0]->getPos(snap);
      snapshotMan_->getSnapshot(snap)->wrapVector(r12);
      return r12.length();
    }